

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> * __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode>::operator=
          (ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *this,
          ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *other)

{
  ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *other_local;
  ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (AuxNode *)0x0;
  other->pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
  other->endPtr = (AuxNode *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }